

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sse_sse4.c
# Opt level: O1

int64_t aom_highbd_sse_sse4_1
                  (uint8_t *a8,int a_stride,uint8_t *b8,int b_stride,int width,int height)

{
  short *psVar1;
  short *psVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  short *psVar8;
  int i;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  short *psVar13;
  uint uVar14;
  long lVar15;
  long lVar17;
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  int iVar32;
  int iVar34;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  int iVar33;
  int iVar35;
  undefined1 auVar31 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  
  psVar13 = (short *)((long)a8 * 2);
  psVar8 = (short *)((long)b8 * 2);
  if (width < 0x20) {
    if (width == 4) {
      iVar12 = 0;
      auVar37 = (undefined1  [16])0x0;
      do {
        uVar3 = *(undefined8 *)(psVar13 + a_stride);
        uVar4 = *(undefined8 *)psVar13;
        uVar9 = *(ulong *)(psVar8 + b_stride);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = uVar9;
        uVar5 = *(undefined8 *)psVar8;
        auVar28._0_2_ = (short)uVar4 - (short)uVar5;
        auVar28._2_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar5 >> 0x10);
        auVar28._4_2_ = (short)((ulong)uVar4 >> 0x20) - (short)((ulong)uVar5 >> 0x20);
        auVar28._6_2_ = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar5 >> 0x30);
        auVar28._8_2_ = (short)uVar3 - (short)uVar9;
        auVar28._10_2_ = (short)((ulong)uVar3 >> 0x10) - (short)(uVar9 >> 0x10);
        auVar28._12_2_ = (short)((ulong)uVar3 >> 0x20) - (short)(uVar9 >> 0x20);
        auVar28._14_2_ = (short)((ulong)uVar3 >> 0x30) - (short)(uVar9 >> 0x30);
        auVar51 = pmaddwd(auVar28,auVar28);
        auVar16._0_4_ = auVar37._0_4_ + auVar51._0_4_;
        auVar16._4_4_ = auVar37._4_4_ + auVar51._4_4_;
        auVar16._8_4_ = auVar37._8_4_ + auVar51._8_4_;
        auVar16._12_4_ = auVar37._12_4_ + auVar51._12_4_;
        iVar12 = iVar12 + 2;
        psVar13 = psVar13 + a_stride * 2;
        psVar8 = psVar8 + b_stride * 2;
        auVar37 = auVar16;
      } while (iVar12 < height);
    }
    else {
      if (width != 8) {
        if (width == 0x10) {
          iVar12 = 0;
          lVar15 = 0;
          lVar17 = 0;
          do {
            auVar20 = (undefined1  [16])0x0;
            iVar32 = 1;
            do {
              auVar36._0_2_ = *psVar13 - *psVar8;
              auVar36._2_2_ = psVar13[1] - psVar8[1];
              auVar36._4_2_ = psVar13[2] - psVar8[2];
              auVar36._6_2_ = psVar13[3] - psVar8[3];
              auVar36._8_2_ = psVar13[4] - psVar8[4];
              auVar36._10_2_ = psVar13[5] - psVar8[5];
              auVar36._12_2_ = psVar13[6] - psVar8[6];
              auVar36._14_2_ = psVar13[7] - psVar8[7];
              auVar37 = pmaddwd(auVar36,auVar36);
              auVar38._0_4_ = auVar37._0_4_ + auVar20._0_4_;
              auVar38._4_4_ = auVar37._4_4_ + auVar20._4_4_;
              auVar38._8_4_ = auVar37._8_4_ + auVar20._8_4_;
              auVar38._12_4_ = auVar37._12_4_ + auVar20._12_4_;
              auVar21._0_2_ = psVar13[8] - psVar8[8];
              auVar21._2_2_ = psVar13[9] - psVar8[9];
              auVar21._4_2_ = psVar13[10] - psVar8[10];
              auVar21._6_2_ = psVar13[0xb] - psVar8[0xb];
              auVar21._8_2_ = psVar13[0xc] - psVar8[0xc];
              auVar21._10_2_ = psVar13[0xd] - psVar8[0xd];
              auVar21._12_2_ = psVar13[0xe] - psVar8[0xe];
              auVar21._14_2_ = psVar13[0xf] - psVar8[0xf];
              auVar37 = pmaddwd(auVar21,auVar21);
              auVar20._0_4_ = auVar37._0_4_ + auVar38._0_4_;
              auVar20._4_4_ = auVar37._4_4_ + auVar38._4_4_;
              auVar20._8_4_ = auVar37._8_4_ + auVar38._8_4_;
              auVar20._12_4_ = auVar37._12_4_ + auVar38._12_4_;
              psVar13 = psVar13 + a_stride;
              psVar8 = psVar8 + b_stride;
              if (0x3e < iVar32 - 1U) break;
              bVar7 = iVar32 < height - iVar12;
              iVar32 = iVar32 + 1;
            } while (bVar7);
            auVar37 = pmovzxdq(auVar38,auVar20);
            lVar15 = lVar15 + auVar37._0_8_ + (ulong)auVar20._8_4_;
            lVar17 = lVar17 + auVar37._8_8_ + (ulong)auVar20._12_4_;
            iVar12 = iVar12 + 0x40;
          } while (iVar12 < height);
          goto LAB_0034167a;
        }
        goto LAB_003413d3;
      }
      iVar12 = 1;
      if (1 < height) {
        iVar12 = height;
      }
      auVar37 = (undefined1  [16])0x0;
      do {
        auVar18._0_2_ = *psVar13 - *psVar8;
        auVar18._2_2_ = psVar13[1] - psVar8[1];
        auVar18._4_2_ = psVar13[2] - psVar8[2];
        auVar18._6_2_ = psVar13[3] - psVar8[3];
        auVar18._8_2_ = psVar13[4] - psVar8[4];
        auVar18._10_2_ = psVar13[5] - psVar8[5];
        auVar18._12_2_ = psVar13[6] - psVar8[6];
        auVar18._14_2_ = psVar13[7] - psVar8[7];
        auVar19 = pmaddwd(auVar18,auVar18);
        auVar16._0_4_ = auVar37._0_4_ + auVar19._0_4_;
        auVar16._4_4_ = auVar37._4_4_ + auVar19._4_4_;
        auVar16._8_4_ = auVar37._8_4_ + auVar19._8_4_;
        auVar16._12_4_ = auVar37._12_4_ + auVar19._12_4_;
        psVar13 = psVar13 + a_stride;
        psVar8 = psVar8 + b_stride;
        iVar12 = iVar12 + -1;
        auVar37 = auVar16;
      } while (iVar12 != 0);
    }
    auVar37 = pmovzxdq(auVar19,auVar16);
    lVar15 = (ulong)auVar16._8_4_ + auVar37._0_8_;
    lVar17 = (ulong)auVar16._12_4_ + auVar37._8_8_;
  }
  else {
    if (width == 0x20) {
      iVar12 = 0;
      lVar15 = 0;
      lVar17 = 0;
      do {
        auVar37 = (undefined1  [16])0x0;
        iVar32 = 1;
        do {
          auVar42._0_2_ = *psVar13 - *psVar8;
          auVar42._2_2_ = psVar13[1] - psVar8[1];
          auVar42._4_2_ = psVar13[2] - psVar8[2];
          auVar42._6_2_ = psVar13[3] - psVar8[3];
          auVar42._8_2_ = psVar13[4] - psVar8[4];
          auVar42._10_2_ = psVar13[5] - psVar8[5];
          auVar42._12_2_ = psVar13[6] - psVar8[6];
          auVar42._14_2_ = psVar13[7] - psVar8[7];
          auVar42 = pmaddwd(auVar42,auVar42);
          auVar44._0_2_ = psVar13[8] - psVar8[8];
          auVar44._2_2_ = psVar13[9] - psVar8[9];
          auVar44._4_2_ = psVar13[10] - psVar8[10];
          auVar44._6_2_ = psVar13[0xb] - psVar8[0xb];
          auVar44._8_2_ = psVar13[0xc] - psVar8[0xc];
          auVar44._10_2_ = psVar13[0xd] - psVar8[0xd];
          auVar44._12_2_ = psVar13[0xe] - psVar8[0xe];
          auVar44._14_2_ = psVar13[0xf] - psVar8[0xf];
          auVar26._0_2_ = psVar13[0x10] - psVar8[0x10];
          auVar26._2_2_ = psVar13[0x11] - psVar8[0x11];
          auVar26._4_2_ = psVar13[0x12] - psVar8[0x12];
          auVar26._6_2_ = psVar13[0x13] - psVar8[0x13];
          auVar26._8_2_ = psVar13[0x14] - psVar8[0x14];
          auVar26._10_2_ = psVar13[0x15] - psVar8[0x15];
          auVar26._12_2_ = psVar13[0x16] - psVar8[0x16];
          auVar26._14_2_ = psVar13[0x17] - psVar8[0x17];
          auVar51._0_2_ = psVar13[0x18] - psVar8[0x18];
          auVar51._2_2_ = psVar13[0x19] - psVar8[0x19];
          auVar51._4_2_ = psVar13[0x1a] - psVar8[0x1a];
          auVar51._6_2_ = psVar13[0x1b] - psVar8[0x1b];
          auVar51._8_2_ = psVar13[0x1c] - psVar8[0x1c];
          auVar51._10_2_ = psVar13[0x1d] - psVar8[0x1d];
          auVar51._12_2_ = psVar13[0x1e] - psVar8[0x1e];
          auVar51._14_2_ = psVar13[0x1f] - psVar8[0x1f];
          auVar44 = pmaddwd(auVar44,auVar44);
          auVar26 = pmaddwd(auVar26,auVar26);
          auVar40._0_4_ = auVar26._0_4_ + auVar44._0_4_ + auVar42._0_4_ + auVar37._0_4_;
          auVar40._4_4_ = auVar26._4_4_ + auVar44._4_4_ + auVar42._4_4_ + auVar37._4_4_;
          auVar40._8_4_ = auVar26._8_4_ + auVar44._8_4_ + auVar42._8_4_ + auVar37._8_4_;
          auVar40._12_4_ = auVar26._12_4_ + auVar44._12_4_ + auVar42._12_4_ + auVar37._12_4_;
          auVar51 = pmaddwd(auVar51,auVar51);
          auVar37._0_4_ = auVar51._0_4_ + auVar40._0_4_;
          auVar37._4_4_ = auVar51._4_4_ + auVar40._4_4_;
          auVar37._8_4_ = auVar51._8_4_ + auVar40._8_4_;
          auVar37._12_4_ = auVar51._12_4_ + auVar40._12_4_;
          psVar13 = psVar13 + a_stride;
          psVar8 = psVar8 + b_stride;
          if (0x1e < iVar32 - 1U) break;
          bVar7 = iVar32 < height - iVar12;
          iVar32 = iVar32 + 1;
        } while (bVar7);
        auVar51 = pmovzxdq(auVar40,auVar37);
        lVar15 = lVar15 + auVar51._0_8_ + (ulong)auVar37._8_4_;
        lVar17 = lVar17 + auVar51._8_8_ + (ulong)auVar37._12_4_;
        iVar12 = iVar12 + 0x20;
      } while (iVar12 < height);
      goto LAB_0034167a;
    }
    if (width == 0x40) {
      iVar12 = 0;
      lVar15 = 0;
      lVar17 = 0;
      do {
        auVar46 = (undefined1  [16])0x0;
        iVar32 = 1;
        do {
          auVar66._0_2_ = *psVar13 - *psVar8;
          auVar66._2_2_ = psVar13[1] - psVar8[1];
          auVar66._4_2_ = psVar13[2] - psVar8[2];
          auVar66._6_2_ = psVar13[3] - psVar8[3];
          auVar66._8_2_ = psVar13[4] - psVar8[4];
          auVar66._10_2_ = psVar13[5] - psVar8[5];
          auVar66._12_2_ = psVar13[6] - psVar8[6];
          auVar66._14_2_ = psVar13[7] - psVar8[7];
          auVar68._0_2_ = psVar13[8] - psVar8[8];
          auVar68._2_2_ = psVar13[9] - psVar8[9];
          auVar68._4_2_ = psVar13[10] - psVar8[10];
          auVar68._6_2_ = psVar13[0xb] - psVar8[0xb];
          auVar68._8_2_ = psVar13[0xc] - psVar8[0xc];
          auVar68._10_2_ = psVar13[0xd] - psVar8[0xd];
          auVar68._12_2_ = psVar13[0xe] - psVar8[0xe];
          auVar68._14_2_ = psVar13[0xf] - psVar8[0xf];
          auVar58._0_2_ = psVar13[0x10] - psVar8[0x10];
          auVar58._2_2_ = psVar13[0x11] - psVar8[0x11];
          auVar58._4_2_ = psVar13[0x12] - psVar8[0x12];
          auVar58._6_2_ = psVar13[0x13] - psVar8[0x13];
          auVar58._8_2_ = psVar13[0x14] - psVar8[0x14];
          auVar58._10_2_ = psVar13[0x15] - psVar8[0x15];
          auVar58._12_2_ = psVar13[0x16] - psVar8[0x16];
          auVar58._14_2_ = psVar13[0x17] - psVar8[0x17];
          auVar62._0_2_ = psVar13[0x18] - psVar8[0x18];
          auVar62._2_2_ = psVar13[0x19] - psVar8[0x19];
          auVar62._4_2_ = psVar13[0x1a] - psVar8[0x1a];
          auVar62._6_2_ = psVar13[0x1b] - psVar8[0x1b];
          auVar62._8_2_ = psVar13[0x1c] - psVar8[0x1c];
          auVar62._10_2_ = psVar13[0x1d] - psVar8[0x1d];
          auVar62._12_2_ = psVar13[0x1e] - psVar8[0x1e];
          auVar62._14_2_ = psVar13[0x1f] - psVar8[0x1f];
          auVar66 = pmaddwd(auVar66,auVar66);
          iVar33 = auVar46._4_4_;
          iVar34 = auVar46._8_4_;
          iVar35 = auVar46._12_4_;
          auVar68 = pmaddwd(auVar68,auVar68);
          auVar26 = pmaddwd(auVar58,auVar58);
          auVar42 = pmaddwd(auVar62,auVar62);
          auVar48._0_2_ = psVar13[0x20] - psVar8[0x20];
          auVar48._2_2_ = psVar13[0x21] - psVar8[0x21];
          auVar48._4_2_ = psVar13[0x22] - psVar8[0x22];
          auVar48._6_2_ = psVar13[0x23] - psVar8[0x23];
          auVar48._8_2_ = psVar13[0x24] - psVar8[0x24];
          auVar48._10_2_ = psVar13[0x25] - psVar8[0x25];
          auVar48._12_2_ = psVar13[0x26] - psVar8[0x26];
          auVar48._14_2_ = psVar13[0x27] - psVar8[0x27];
          auVar37 = pmaddwd(auVar48,auVar48);
          auVar64._0_2_ = psVar13[0x28] - psVar8[0x28];
          auVar64._2_2_ = psVar13[0x29] - psVar8[0x29];
          auVar64._4_2_ = psVar13[0x2a] - psVar8[0x2a];
          auVar64._6_2_ = psVar13[0x2b] - psVar8[0x2b];
          auVar64._8_2_ = psVar13[0x2c] - psVar8[0x2c];
          auVar64._10_2_ = psVar13[0x2d] - psVar8[0x2d];
          auVar64._12_2_ = psVar13[0x2e] - psVar8[0x2e];
          auVar64._14_2_ = psVar13[0x2f] - psVar8[0x2f];
          auVar44 = pmaddwd(auVar64,auVar64);
          auVar60._0_2_ = psVar13[0x30] - psVar8[0x30];
          auVar60._2_2_ = psVar13[0x31] - psVar8[0x31];
          auVar60._4_2_ = psVar13[0x32] - psVar8[0x32];
          auVar60._6_2_ = psVar13[0x33] - psVar8[0x33];
          auVar60._8_2_ = psVar13[0x34] - psVar8[0x34];
          auVar60._10_2_ = psVar13[0x35] - psVar8[0x35];
          auVar60._12_2_ = psVar13[0x36] - psVar8[0x36];
          auVar60._14_2_ = psVar13[0x37] - psVar8[0x37];
          auVar40 = pmaddwd(auVar60,auVar60);
          auVar56._0_2_ = psVar13[0x38] - psVar8[0x38];
          auVar56._2_2_ = psVar13[0x39] - psVar8[0x39];
          auVar56._4_2_ = psVar13[0x3a] - psVar8[0x3a];
          auVar56._6_2_ = psVar13[0x3b] - psVar8[0x3b];
          auVar56._8_2_ = psVar13[0x3c] - psVar8[0x3c];
          auVar56._10_2_ = psVar13[0x3d] - psVar8[0x3d];
          auVar56._12_2_ = psVar13[0x3e] - psVar8[0x3e];
          auVar56._14_2_ = psVar13[0x3f] - psVar8[0x3f];
          auVar51 = pmaddwd(auVar56,auVar56);
          auVar46._0_4_ =
               auVar51._0_4_ + auVar40._0_4_ +
               auVar44._0_4_ + auVar37._0_4_ + auVar42._0_4_ +
               auVar26._0_4_ + auVar68._0_4_ + auVar66._0_4_ + auVar46._0_4_;
          auVar46._4_4_ =
               auVar51._4_4_ + auVar40._4_4_ +
               auVar44._4_4_ + auVar37._4_4_ + auVar42._4_4_ +
               auVar26._4_4_ + auVar68._4_4_ + auVar66._4_4_ + iVar33;
          auVar46._8_4_ =
               auVar51._8_4_ + auVar40._8_4_ +
               auVar44._8_4_ + auVar37._8_4_ + auVar42._8_4_ +
               auVar26._8_4_ + auVar68._8_4_ + auVar66._8_4_ + iVar34;
          auVar46._12_4_ =
               auVar51._12_4_ + auVar40._12_4_ +
               auVar44._12_4_ + auVar37._12_4_ + auVar42._12_4_ +
               auVar26._12_4_ + auVar68._12_4_ + auVar66._12_4_ + iVar35;
          psVar13 = psVar13 + a_stride;
          psVar8 = psVar8 + b_stride;
          if (0xe < iVar32 - 1U) break;
          bVar7 = iVar32 < height - iVar12;
          iVar32 = iVar32 + 1;
        } while (bVar7);
        auVar37 = pmovzxdq(auVar40,auVar46);
        lVar15 = lVar15 + auVar37._0_8_ + (ulong)auVar46._8_4_;
        lVar17 = lVar17 + auVar37._8_8_ + (ulong)auVar46._12_4_;
        iVar12 = iVar12 + 0x10;
      } while (iVar12 < height);
      goto LAB_0034167a;
    }
    if (width == 0x80) {
      iVar12 = 0;
      lVar15 = 0;
      lVar17 = 0;
      do {
        auVar22 = (undefined1  [16])0x0;
        iVar32 = 1;
        do {
          auVar63._0_2_ = *psVar13 - *psVar8;
          auVar63._2_2_ = psVar13[1] - psVar8[1];
          auVar63._4_2_ = psVar13[2] - psVar8[2];
          auVar63._6_2_ = psVar13[3] - psVar8[3];
          auVar63._8_2_ = psVar13[4] - psVar8[4];
          auVar63._10_2_ = psVar13[5] - psVar8[5];
          auVar63._12_2_ = psVar13[6] - psVar8[6];
          auVar63._14_2_ = psVar13[7] - psVar8[7];
          auVar67._0_2_ = psVar13[8] - psVar8[8];
          auVar67._2_2_ = psVar13[9] - psVar8[9];
          auVar67._4_2_ = psVar13[10] - psVar8[10];
          auVar67._6_2_ = psVar13[0xb] - psVar8[0xb];
          auVar67._8_2_ = psVar13[0xc] - psVar8[0xc];
          auVar67._10_2_ = psVar13[0xd] - psVar8[0xd];
          auVar67._12_2_ = psVar13[0xe] - psVar8[0xe];
          auVar67._14_2_ = psVar13[0xf] - psVar8[0xf];
          auVar39._0_2_ = psVar13[0x10] - psVar8[0x10];
          auVar39._2_2_ = psVar13[0x11] - psVar8[0x11];
          auVar39._4_2_ = psVar13[0x12] - psVar8[0x12];
          auVar39._6_2_ = psVar13[0x13] - psVar8[0x13];
          auVar39._8_2_ = psVar13[0x14] - psVar8[0x14];
          auVar39._10_2_ = psVar13[0x15] - psVar8[0x15];
          auVar39._12_2_ = psVar13[0x16] - psVar8[0x16];
          auVar39._14_2_ = psVar13[0x17] - psVar8[0x17];
          auVar55._0_2_ = psVar13[0x18] - psVar8[0x18];
          auVar55._2_2_ = psVar13[0x19] - psVar8[0x19];
          auVar55._4_2_ = psVar13[0x1a] - psVar8[0x1a];
          auVar55._6_2_ = psVar13[0x1b] - psVar8[0x1b];
          auVar55._8_2_ = psVar13[0x1c] - psVar8[0x1c];
          auVar55._10_2_ = psVar13[0x1d] - psVar8[0x1d];
          auVar55._12_2_ = psVar13[0x1e] - psVar8[0x1e];
          auVar55._14_2_ = psVar13[0x1f] - psVar8[0x1f];
          auVar64 = pmaddwd(auVar63,auVar63);
          auVar68 = pmaddwd(auVar67,auVar67);
          auVar40 = pmaddwd(auVar39,auVar39);
          auVar56 = pmaddwd(auVar55,auVar55);
          auVar23._0_2_ = psVar13[0x20] - psVar8[0x20];
          auVar23._2_2_ = psVar13[0x21] - psVar8[0x21];
          auVar23._4_2_ = psVar13[0x22] - psVar8[0x22];
          auVar23._6_2_ = psVar13[0x23] - psVar8[0x23];
          auVar23._8_2_ = psVar13[0x24] - psVar8[0x24];
          auVar23._10_2_ = psVar13[0x25] - psVar8[0x25];
          auVar23._12_2_ = psVar13[0x26] - psVar8[0x26];
          auVar23._14_2_ = psVar13[0x27] - psVar8[0x27];
          auVar37 = pmaddwd(auVar23,auVar23);
          auVar57._0_2_ = psVar13[0x28] - psVar8[0x28];
          auVar57._2_2_ = psVar13[0x29] - psVar8[0x29];
          auVar57._4_2_ = psVar13[0x2a] - psVar8[0x2a];
          auVar57._6_2_ = psVar13[0x2b] - psVar8[0x2b];
          auVar57._8_2_ = psVar13[0x2c] - psVar8[0x2c];
          auVar57._10_2_ = psVar13[0x2d] - psVar8[0x2d];
          auVar57._12_2_ = psVar13[0x2e] - psVar8[0x2e];
          auVar57._14_2_ = psVar13[0x2f] - psVar8[0x2f];
          auVar58 = pmaddwd(auVar57,auVar57);
          auVar24._0_2_ = psVar13[0x30] - psVar8[0x30];
          auVar24._2_2_ = psVar13[0x31] - psVar8[0x31];
          auVar24._4_2_ = psVar13[0x32] - psVar8[0x32];
          auVar24._6_2_ = psVar13[0x33] - psVar8[0x33];
          auVar24._8_2_ = psVar13[0x34] - psVar8[0x34];
          auVar24._10_2_ = psVar13[0x35] - psVar8[0x35];
          auVar24._12_2_ = psVar13[0x36] - psVar8[0x36];
          auVar24._14_2_ = psVar13[0x37] - psVar8[0x37];
          auVar51 = pmaddwd(auVar24,auVar24);
          auVar41._0_2_ = psVar13[0x38] - psVar8[0x38];
          auVar41._2_2_ = psVar13[0x39] - psVar8[0x39];
          auVar41._4_2_ = psVar13[0x3a] - psVar8[0x3a];
          auVar41._6_2_ = psVar13[0x3b] - psVar8[0x3b];
          auVar41._8_2_ = psVar13[0x3c] - psVar8[0x3c];
          auVar41._10_2_ = psVar13[0x3d] - psVar8[0x3d];
          auVar41._12_2_ = psVar13[0x3e] - psVar8[0x3e];
          auVar41._14_2_ = psVar13[0x3f] - psVar8[0x3f];
          auVar42 = pmaddwd(auVar41,auVar41);
          auVar65._0_2_ = psVar13[0x40] - psVar8[0x40];
          auVar65._2_2_ = psVar13[0x41] - psVar8[0x41];
          auVar65._4_2_ = psVar13[0x42] - psVar8[0x42];
          auVar65._6_2_ = psVar13[0x43] - psVar8[0x43];
          auVar65._8_2_ = psVar13[0x44] - psVar8[0x44];
          auVar65._10_2_ = psVar13[0x45] - psVar8[0x45];
          auVar65._12_2_ = psVar13[0x46] - psVar8[0x46];
          auVar65._14_2_ = psVar13[0x47] - psVar8[0x47];
          auVar66 = pmaddwd(auVar65,auVar65);
          auVar25._0_2_ = psVar13[0x48] - psVar8[0x48];
          auVar25._2_2_ = psVar13[0x49] - psVar8[0x49];
          auVar25._4_2_ = psVar13[0x4a] - psVar8[0x4a];
          auVar25._6_2_ = psVar13[0x4b] - psVar8[0x4b];
          auVar25._8_2_ = psVar13[0x4c] - psVar8[0x4c];
          auVar25._10_2_ = psVar13[0x4d] - psVar8[0x4d];
          auVar25._12_2_ = psVar13[0x4e] - psVar8[0x4e];
          auVar25._14_2_ = psVar13[0x4f] - psVar8[0x4f];
          auVar26 = pmaddwd(auVar25,auVar25);
          auVar43._0_2_ = psVar13[0x50] - psVar8[0x50];
          auVar43._2_2_ = psVar13[0x51] - psVar8[0x51];
          auVar43._4_2_ = psVar13[0x52] - psVar8[0x52];
          auVar43._6_2_ = psVar13[0x53] - psVar8[0x53];
          auVar43._8_2_ = psVar13[0x54] - psVar8[0x54];
          auVar43._10_2_ = psVar13[0x55] - psVar8[0x55];
          auVar43._12_2_ = psVar13[0x56] - psVar8[0x56];
          auVar43._14_2_ = psVar13[0x57] - psVar8[0x57];
          auVar44 = pmaddwd(auVar43,auVar43);
          auVar59._0_2_ = psVar13[0x58] - psVar8[0x58];
          auVar59._2_2_ = psVar13[0x59] - psVar8[0x59];
          auVar59._4_2_ = psVar13[0x5a] - psVar8[0x5a];
          auVar59._6_2_ = psVar13[0x5b] - psVar8[0x5b];
          auVar59._8_2_ = psVar13[0x5c] - psVar8[0x5c];
          auVar59._10_2_ = psVar13[0x5d] - psVar8[0x5d];
          auVar59._12_2_ = psVar13[0x5e] - psVar8[0x5e];
          auVar59._14_2_ = psVar13[0x5f] - psVar8[0x5f];
          auVar60 = pmaddwd(auVar59,auVar59);
          auVar45._0_2_ = psVar13[0x60] - psVar8[0x60];
          auVar45._2_2_ = psVar13[0x61] - psVar8[0x61];
          auVar45._4_2_ = psVar13[0x62] - psVar8[0x62];
          auVar45._6_2_ = psVar13[99] - psVar8[99];
          auVar45._8_2_ = psVar13[100] - psVar8[100];
          auVar45._10_2_ = psVar13[0x65] - psVar8[0x65];
          auVar45._12_2_ = psVar13[0x66] - psVar8[0x66];
          auVar45._14_2_ = psVar13[0x67] - psVar8[0x67];
          auVar46 = pmaddwd(auVar45,auVar45);
          auVar61._0_2_ = psVar13[0x68] - psVar8[0x68];
          auVar61._2_2_ = psVar13[0x69] - psVar8[0x69];
          auVar61._4_2_ = psVar13[0x6a] - psVar8[0x6a];
          auVar61._6_2_ = psVar13[0x6b] - psVar8[0x6b];
          auVar61._8_2_ = psVar13[0x6c] - psVar8[0x6c];
          auVar61._10_2_ = psVar13[0x6d] - psVar8[0x6d];
          auVar61._12_2_ = psVar13[0x6e] - psVar8[0x6e];
          auVar61._14_2_ = psVar13[0x6f] - psVar8[0x6f];
          auVar62 = pmaddwd(auVar61,auVar61);
          auVar47._0_2_ = psVar13[0x70] - psVar8[0x70];
          auVar47._2_2_ = psVar13[0x71] - psVar8[0x71];
          auVar47._4_2_ = psVar13[0x72] - psVar8[0x72];
          auVar47._6_2_ = psVar13[0x73] - psVar8[0x73];
          auVar47._8_2_ = psVar13[0x74] - psVar8[0x74];
          auVar47._10_2_ = psVar13[0x75] - psVar8[0x75];
          auVar47._12_2_ = psVar13[0x76] - psVar8[0x76];
          auVar47._14_2_ = psVar13[0x77] - psVar8[0x77];
          auVar48 = pmaddwd(auVar47,auVar47);
          auVar49._0_4_ =
               auVar48._0_4_ + auVar62._0_4_ + auVar46._0_4_ + auVar60._0_4_ + auVar44._0_4_ +
               auVar26._0_4_ + auVar66._0_4_ + auVar42._0_4_ + auVar51._0_4_ +
               auVar58._0_4_ + auVar37._0_4_ + auVar56._0_4_ +
               auVar40._0_4_ + auVar68._0_4_ + auVar64._0_4_ + auVar22._0_4_;
          auVar49._4_4_ =
               auVar48._4_4_ + auVar62._4_4_ + auVar46._4_4_ + auVar60._4_4_ + auVar44._4_4_ +
               auVar26._4_4_ + auVar66._4_4_ + auVar42._4_4_ + auVar51._4_4_ +
               auVar58._4_4_ + auVar37._4_4_ + auVar56._4_4_ +
               auVar40._4_4_ + auVar68._4_4_ + auVar64._4_4_ + auVar22._4_4_;
          auVar49._8_4_ =
               auVar48._8_4_ + auVar62._8_4_ + auVar46._8_4_ + auVar60._8_4_ + auVar44._8_4_ +
               auVar26._8_4_ + auVar66._8_4_ + auVar42._8_4_ + auVar51._8_4_ +
               auVar58._8_4_ + auVar37._8_4_ + auVar56._8_4_ +
               auVar40._8_4_ + auVar68._8_4_ + auVar64._8_4_ + auVar22._8_4_;
          auVar49._12_4_ =
               auVar48._12_4_ + auVar62._12_4_ + auVar46._12_4_ + auVar60._12_4_ + auVar44._12_4_ +
               auVar26._12_4_ + auVar66._12_4_ + auVar42._12_4_ + auVar51._12_4_ +
               auVar58._12_4_ + auVar37._12_4_ + auVar56._12_4_ +
               auVar40._12_4_ + auVar68._12_4_ + auVar64._12_4_ + auVar22._12_4_;
          auVar27._0_2_ = psVar13[0x78] - psVar8[0x78];
          auVar27._2_2_ = psVar13[0x79] - psVar8[0x79];
          auVar27._4_2_ = psVar13[0x7a] - psVar8[0x7a];
          auVar27._6_2_ = psVar13[0x7b] - psVar8[0x7b];
          auVar27._8_2_ = psVar13[0x7c] - psVar8[0x7c];
          auVar27._10_2_ = psVar13[0x7d] - psVar8[0x7d];
          auVar27._12_2_ = psVar13[0x7e] - psVar8[0x7e];
          auVar27._14_2_ = psVar13[0x7f] - psVar8[0x7f];
          auVar37 = pmaddwd(auVar27,auVar27);
          auVar22._0_4_ = auVar37._0_4_ + auVar49._0_4_;
          auVar22._4_4_ = auVar37._4_4_ + auVar49._4_4_;
          auVar22._8_4_ = auVar37._8_4_ + auVar49._8_4_;
          auVar22._12_4_ = auVar37._12_4_ + auVar49._12_4_;
          psVar13 = psVar13 + a_stride;
          psVar8 = psVar8 + b_stride;
          if (6 < iVar32 - 1U) break;
          bVar7 = iVar32 < height - iVar12;
          iVar32 = iVar32 + 1;
        } while (bVar7);
        auVar37 = pmovzxdq(auVar49,auVar22);
        lVar15 = lVar15 + auVar37._0_8_ + (ulong)auVar22._8_4_;
        lVar17 = lVar17 + auVar37._8_8_ + (ulong)auVar22._12_4_;
        iVar12 = iVar12 + 8;
      } while (iVar12 < height);
      goto LAB_0034167a;
    }
LAB_003413d3:
    if ((width & 7U) == 0) {
      iVar12 = 0;
      lVar15 = 0;
      lVar17 = 0;
      do {
        auVar31 = (undefined1  [16])0x0;
        uVar14 = 0;
        do {
          lVar11 = 0;
          auVar37 = auVar31;
          do {
            psVar1 = psVar13 + lVar11;
            psVar2 = psVar8 + lVar11;
            auVar54._0_2_ = *psVar1 - *psVar2;
            auVar54._2_2_ = psVar1[1] - psVar2[1];
            auVar54._4_2_ = psVar1[2] - psVar2[2];
            auVar54._6_2_ = psVar1[3] - psVar2[3];
            auVar54._8_2_ = psVar1[4] - psVar2[4];
            auVar54._10_2_ = psVar1[5] - psVar2[5];
            auVar54._12_2_ = psVar1[6] - psVar2[6];
            auVar54._14_2_ = psVar1[7] - psVar2[7];
            auVar51 = pmaddwd(auVar54,auVar54);
            auVar31._0_4_ = auVar37._0_4_ + auVar51._0_4_;
            auVar31._4_4_ = auVar37._4_4_ + auVar51._4_4_;
            auVar31._8_4_ = auVar37._8_4_ + auVar51._8_4_;
            auVar31._12_4_ = auVar37._12_4_ + auVar51._12_4_;
            lVar11 = lVar11 + 8;
            auVar37 = auVar31;
          } while (lVar11 < width);
          psVar13 = psVar13 + a_stride;
          psVar8 = psVar8 + b_stride;
        } while ((uVar14 < 7) && (uVar14 = uVar14 + 1, (int)uVar14 < height - iVar12));
        auVar37 = pmovzxdq(auVar51,auVar31);
        lVar15 = lVar15 + auVar37._0_8_ + (ulong)auVar31._8_4_;
        lVar17 = lVar17 + auVar37._8_8_ + (ulong)auVar31._12_4_;
        iVar12 = iVar12 + 8;
      } while (iVar12 < height);
    }
    else {
      iVar12 = 0;
      lVar15 = 0;
      lVar17 = 0;
      do {
        auVar29 = (undefined1  [16])0x0;
        uVar9 = 0;
        do {
          psVar1 = psVar13 + uVar9;
          psVar2 = psVar8 + uVar9;
          auVar50._0_2_ = *psVar1 - *psVar2;
          auVar50._2_2_ = psVar1[1] - psVar2[1];
          auVar50._4_2_ = psVar1[2] - psVar2[2];
          auVar50._6_2_ = psVar1[3] - psVar2[3];
          auVar50._8_2_ = psVar1[4] - psVar2[4];
          auVar50._10_2_ = psVar1[5] - psVar2[5];
          auVar50._12_2_ = psVar1[6] - psVar2[6];
          auVar50._14_2_ = psVar1[7] - psVar2[7];
          auVar51 = pmaddwd(auVar50,auVar50);
          iVar32 = auVar29._4_4_;
          iVar33 = auVar29._8_4_;
          iVar34 = auVar29._12_4_;
          psVar1 = psVar1 + a_stride;
          psVar2 = psVar2 + b_stride;
          auVar30._0_2_ = *psVar1 - *psVar2;
          auVar30._2_2_ = psVar1[1] - psVar2[1];
          auVar30._4_2_ = psVar1[2] - psVar2[2];
          auVar30._6_2_ = psVar1[3] - psVar2[3];
          auVar30._8_2_ = psVar1[4] - psVar2[4];
          auVar30._10_2_ = psVar1[5] - psVar2[5];
          auVar30._12_2_ = psVar1[6] - psVar2[6];
          auVar30._14_2_ = psVar1[7] - psVar2[7];
          auVar37 = pmaddwd(auVar30,auVar30);
          auVar29._0_4_ = auVar37._0_4_ + auVar51._0_4_ + auVar29._0_4_;
          auVar29._4_4_ = auVar37._4_4_ + auVar51._4_4_ + iVar32;
          auVar29._8_4_ = auVar37._8_4_ + auVar51._8_4_ + iVar33;
          auVar29._12_4_ = auVar37._12_4_ + auVar51._12_4_ + iVar34;
          uVar10 = uVar9 + 8;
          bVar7 = (long)uVar9 < (long)width + -0xc;
          uVar9 = uVar10;
        } while (bVar7);
        uVar10 = uVar10 & 0xffffffff;
        uVar3 = *(undefined8 *)(psVar13 + uVar10);
        uVar4 = *(undefined8 *)(psVar13 + uVar10 + (long)a_stride);
        uVar5 = *(undefined8 *)(psVar8 + uVar10);
        uVar6 = *(undefined8 *)(psVar8 + uVar10 + (long)b_stride);
        auVar52._0_2_ = (short)uVar3 - (short)uVar5;
        auVar52._2_2_ = (short)((ulong)uVar3 >> 0x10) - (short)((ulong)uVar5 >> 0x10);
        auVar52._4_2_ = (short)((ulong)uVar3 >> 0x20) - (short)((ulong)uVar5 >> 0x20);
        auVar52._6_2_ = (short)((ulong)uVar3 >> 0x30) - (short)((ulong)uVar5 >> 0x30);
        auVar52._8_2_ = (short)uVar4 - (short)uVar6;
        auVar52._10_2_ = (short)((ulong)uVar4 >> 0x10) - (short)((ulong)uVar6 >> 0x10);
        auVar52._12_2_ = (short)((ulong)uVar4 >> 0x20) - (short)((ulong)uVar6 >> 0x20);
        auVar52._14_2_ = (short)((ulong)uVar4 >> 0x30) - (short)((ulong)uVar6 >> 0x30);
        auVar37 = pmaddwd(auVar52,auVar52);
        auVar53._0_4_ = auVar37._0_4_ + auVar29._0_4_;
        auVar53._4_4_ = auVar37._4_4_ + auVar29._4_4_;
        auVar53._8_4_ = auVar37._8_4_ + auVar29._8_4_;
        auVar53._12_4_ = auVar37._12_4_ + auVar29._12_4_;
        psVar13 = psVar13 + a_stride * 2;
        psVar8 = psVar8 + b_stride * 2;
        iVar12 = iVar12 + 2;
        auVar37 = pmovzxdq(auVar29,auVar53);
        lVar15 = lVar15 + auVar37._0_8_ + (ulong)auVar53._8_4_;
        lVar17 = lVar17 + auVar37._8_8_ + (ulong)auVar53._12_4_;
      } while (iVar12 < height);
    }
  }
LAB_0034167a:
  return lVar17 + lVar15;
}

Assistant:

int64_t aom_highbd_sse_sse4_1(const uint8_t *a8, int a_stride,
                              const uint8_t *b8, int b_stride, int width,
                              int height) {
  int32_t y = 0;
  int64_t sse = 0;
  uint16_t *a = CONVERT_TO_SHORTPTR(a8);
  uint16_t *b = CONVERT_TO_SHORTPTR(b8);
  __m128i sum = _mm_setzero_si128();
  switch (width) {
    case 4:
      do {
        highbd_sse_w4x2_sse4_1(&sum, a, a_stride, b, b_stride);
        a += a_stride << 1;
        b += b_stride << 1;
        y += 2;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 8:
      do {
        highbd_sse_w8_sse4_1(&sum, a, b);
        a += a_stride;
        b += b_stride;
        y += 1;
      } while (y < height);
      sse = summary_all_sse4(&sum);
      break;
    case 16:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8, b + 8);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 64 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 64;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 32:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 32 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 32;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 64:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 16 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 16;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    case 128:
      do {
        int l = 0;
        __m128i sum32 = _mm_setzero_si128();
        do {
          highbd_sse_w8_sse4_1(&sum32, a, b);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 1, b + 8 * 1);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 2, b + 8 * 2);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 3, b + 8 * 3);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 4, b + 8 * 4);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 5, b + 8 * 5);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 6, b + 8 * 6);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 7, b + 8 * 7);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 8, b + 8 * 8);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 9, b + 8 * 9);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 10, b + 8 * 10);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 11, b + 8 * 11);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 12, b + 8 * 12);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 13, b + 8 * 13);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 14, b + 8 * 14);
          highbd_sse_w8_sse4_1(&sum32, a + 8 * 15, b + 8 * 15);
          a += a_stride;
          b += b_stride;
          l += 1;
        } while (l < 8 && l < (height - y));
        summary_32_sse4(&sum32, &sum);
        y += 8;
      } while (y < height);
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
    default:
      if (width & 0x7) {
        do {
          __m128i sum32 = _mm_setzero_si128();
          int i = 0;
          do {
            highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
            highbd_sse_w8_sse4_1(&sum32, a + i + a_stride, b + i + b_stride);
            i += 8;
          } while (i + 4 < width);
          highbd_sse_w4x2_sse4_1(&sum32, a + i, a_stride, b + i, b_stride);
          a += (a_stride << 1);
          b += (b_stride << 1);
          y += 2;
          summary_32_sse4(&sum32, &sum);
        } while (y < height);
      } else {
        do {
          int l = 0;
          __m128i sum32 = _mm_setzero_si128();
          do {
            int i = 0;
            do {
              highbd_sse_w8_sse4_1(&sum32, a + i, b + i);
              i += 8;
            } while (i < width);
            a += a_stride;
            b += b_stride;
            l += 1;
          } while (l < 8 && l < (height - y));
          summary_32_sse4(&sum32, &sum);
          y += 8;
        } while (y < height);
      }
      xx_storel_64(&sse, _mm_add_epi64(sum, _mm_srli_si128(sum, 8)));
      break;
  }
  return sse;
}